

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opj_getopt.c
# Opt level: O0

int opj_getopt(int nargc,char **nargv,char *ostr)

{
  char *pcVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  char *pcVar2;
  char *oli;
  char *ostr_local;
  char **nargv_local;
  int nargc_local;
  
  pcVar2 = (char *)0x0;
  if ((opj_optreset != 0) || (*opj_getopt::place == '\0')) {
    opj_optreset = 0;
    if ((nargc <= opj_optind) || (pcVar1 = nargv[opj_optind], *pcVar1 != '-')) {
      opj_getopt::place = EMSG;
      opj_optreset = 0;
      return -1;
    }
    opj_getopt::place = pcVar1;
    if ((pcVar1[1] != '\0') && (opj_getopt::place = pcVar1 + 1, pcVar1[1] == '-')) {
      opj_getopt::place = EMSG;
      opj_optind = opj_optind + 1;
      opj_optreset = 0;
      return -1;
    }
  }
  pcVar1 = opj_getopt::place + 1;
  opj_optopt = (int)*opj_getopt::place;
  opj_getopt::place = pcVar1;
  if ((opj_optopt == 0x3a) || (pcVar2 = strchr(ostr,opj_optopt), pcVar2 == (char *)0x0)) {
    if (opj_optopt == 0x2d) {
      return -1;
    }
    if (*opj_getopt::place == '\0') {
      opj_optind = opj_optind + 1;
    }
    if ((opj_opterr != 0) && (*ostr != ':')) {
      fprintf(_stderr,"%s: illegal option -- %c\n",*nargv,(ulong)(uint)opj_optopt);
      return 0x3f;
    }
  }
  if (pcVar2[1] == ':') {
    if (*opj_getopt::place == '\0') {
      opj_optind = opj_optind + 1;
      if (opj_optind < nargc) {
        opj_optarg = nargv[opj_optind];
      }
      else {
        opj_getopt::place = EMSG;
        if (*ostr == ':') {
          return 0x3a;
        }
        if (opj_opterr != 0) {
          fprintf(_stderr,"%s: option requires an argument -- %c\n",*nargv,(ulong)(uint)opj_optopt,
                  in_R8,in_R9,pcVar2 + 1);
          return 0x3f;
        }
      }
    }
    else {
      opj_optarg = opj_getopt::place;
    }
    opj_getopt::place = EMSG;
    opj_optind = opj_optind + 1;
  }
  else {
    opj_optarg = (char *)0x0;
    if (*opj_getopt::place == '\0') {
      opj_optind = opj_optind + 1;
    }
  }
  return opj_optopt;
}

Assistant:

int opj_getopt(int nargc, char *const *nargv, const char *ostr)
{
#  define __progname nargv[0]
    static char *place = EMSG;    /* option letter processing */
    const char *oli = NULL;   /* option letter list index */

    if (opj_optreset || !*place) {    /* update scanning pointer */
        opj_optreset = 0;
        if (opj_optind >= nargc || *(place = nargv[opj_optind]) != '-') {
            place = EMSG;
            return (-1);
        }
        if (place[1] && *++place == '-') {  /* found "--" */
            ++opj_optind;
            place = EMSG;
            return (-1);
        }
    }             /* option letter okay? */
    if ((opj_optopt = (int) * place++) == (int) ':' ||
            !(oli = strchr(ostr, opj_optopt))) {
        /*
         * if the user didn't specify '-' as an option,
         * assume it means -1.
         */
        if (opj_optopt == (int) '-') {
            return (-1);
        }
        if (!*place) {
            ++opj_optind;
        }
        if (opj_opterr && *ostr != ':') {
            fprintf(stderr,
                    "%s: illegal option -- %c\n", __progname, opj_optopt);
            return (BADCH);
        }
    }
    if (*++oli != ':') {      /* don't need argument */
        opj_optarg = NULL;
        if (!*place) {
            ++opj_optind;
        }
    } else {          /* need an argument */
        if (*place) {       /* no white space */
            opj_optarg = place;
        } else if (nargc <= ++opj_optind) { /* no arg */
            place = EMSG;
            if (*ostr == ':') {
                return (BADARG);
            }
            if (opj_opterr) {
                fprintf(stderr,
                        "%s: option requires an argument -- %c\n",
                        __progname, opj_optopt);
                return (BADCH);
            }
        } else {        /* white space */
            opj_optarg = nargv[opj_optind];
        }
        place = EMSG;
        ++opj_optind;
    }
    return (opj_optopt);      /* dump back option letter */
}